

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorOutputStream.hpp
# Opt level: O0

void __thiscall
binlog::detail::RecoverableVectorOutputStream::RecoverableVectorOutputStream
          (RecoverableVectorOutputStream *this,uint64_t magic,void *id)

{
  char *pcVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *buffer;
  size_type in_stack_ffffffffffffffd8;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x103b1a);
  std::vector<char,_std::allocator<char>_>::resize
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  pcVar1 = std::vector<char,_std::allocator<char>_>::data
                     ((vector<char,_std::allocator<char>_> *)0x103b35);
  *(undefined8 *)pcVar1 = in_RSI;
  *(undefined8 *)(pcVar1 + 8) = in_RDX;
  pcVar1[0x10] = '\0';
  pcVar1[0x11] = '\0';
  pcVar1[0x12] = '\0';
  pcVar1[0x13] = '\0';
  pcVar1[0x14] = '\0';
  pcVar1[0x15] = '\0';
  pcVar1[0x16] = '\0';
  pcVar1[0x17] = '\0';
  return;
}

Assistant:

RecoverableVectorOutputStream(std::uint64_t magic, void* id)
  {
    _vector.resize(HeaderSize);
    char* buffer = _vector.data();

    memcpy(buffer, &magic, sizeof(magic));
    buffer += sizeof(magic);

    memcpy(buffer, &id, sizeof(id));
    buffer += sizeof(id);

    new (buffer) std::uint64_t{0}; // size
  }